

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadEffect(ColladaParser *this,Effect *pEffect)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator local_39;
  string local_38;
  
  do {
    while( true ) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 != 1) break;
      bVar1 = IsElement(this,"profile_COMMON");
      if (bVar1) {
        ReadEffectProfileCommon(this,pEffect);
      }
      else {
        SkipElement(this);
      }
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  } while (iVar2 != 2);
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"effect");
  if (iVar2 == 0) {
    return;
  }
  std::__cxx11::string::string((string *)&local_38,"Expected end of <effect> element.",&local_39);
  ThrowException(this,&local_38);
}

Assistant:

void ColladaParser::ReadEffect(Collada::Effect& pEffect)
{
    // for the moment we don't support any other type of effect.
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("profile_COMMON"))
                ReadEffectProfileCommon(pEffect);
            else
                SkipElement();
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "effect") != 0)
                ThrowException("Expected end of <effect> element.");

            break;
        }
    }
}